

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy,QRect *r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  QWidgetPrivate *this_00;
  long lVar6;
  QGraphicsProxyWidget *this_01;
  char cVar7;
  QWidget *pQVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  QRect *rect;
  long in_FS_OFFSET;
  int iVar11;
  int iVar12;
  int iVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar18;
  undefined1 auVar16 [16];
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = this->data->widget_attributes;
  if (((((uVar5 >> 10 & 1) == 0) || (*(long *)(*(long *)&this->field_0x8 + 0x28) != 0)) &&
      (dy != 0 || dx != 0)) && ((uVar5 & 0x8000) != 0)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    pQVar8 = this;
    do {
      lVar6 = *(long *)(*(long *)&pQVar8->field_0x8 + 0x78);
      if ((lVar6 != 0) &&
         (this_01 = *(QGraphicsProxyWidget **)(lVar6 + 0x10), this_01 != (QGraphicsProxyWidget *)0x0
         )) {
        cVar7 = QRegion::isEmpty();
        if (cVar7 == '\0') {
          QRegion::translated((int)&local_58,(int)this_00 + 0xe0);
          QRegion::operator&((QRegion *)&local_78,(QRect *)&local_58);
          QRegion::~QRegion((QRegion *)&local_58);
          puVar9 = (undefined8 *)QRegion::begin();
          puVar10 = (undefined8 *)QRegion::end();
          if (puVar9 != puVar10) {
            do {
              iVar11 = (int)*puVar9;
              local_58.xp = (qreal)iVar11;
              iVar12 = (int)((ulong)*puVar9 >> 0x20);
              local_58.yp = (qreal)iVar12;
              local_58.w = (qreal)(((long)*(int *)(puVar9 + 1) - (long)iVar11) + 1);
              local_58.h = (qreal)(((long)*(int *)((long)puVar9 + 0xc) - (long)iVar12) + 1);
              QGraphicsItem::update((QGraphicsItem *)(this_01 + 0x10),&local_58);
              puVar9 = puVar9 + 2;
            } while (puVar9 != puVar10);
          }
          QRegion::~QRegion((QRegion *)&local_78);
        }
        QGraphicsProxyWidget::subWidgetRect(&local_78,this_01,this);
        auVar13._0_8_ =
             (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.xp;
        auVar13._8_8_ =
             (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.yp;
        auVar14 = maxpd(auVar13,_DAT_006605e0);
        iVar11 = (int)(double)(~-(ulong)(2147483647.0 < auVar13._0_8_) & auVar14._0_8_ |
                              -(ulong)(2147483647.0 < auVar13._0_8_) & 0x41dfffffffc00000);
        iVar12 = (int)(double)(~-(ulong)(2147483647.0 < auVar13._8_8_) & auVar14._8_8_ |
                              -(ulong)(2147483647.0 < auVar13._8_8_) & 0x41dfffffffc00000);
        uVar1 = r->x1;
        uVar3 = r->y1;
        iVar17 = uVar1 + iVar11;
        auVar15._4_4_ = uVar3 + iVar12;
        uVar2 = r->x2;
        uVar4 = r->y2;
        iVar18 = uVar2 + iVar11;
        auVar16._4_4_ = uVar4 + iVar12;
        local_58.xp = (qreal)iVar17;
        local_58.yp = (qreal)auVar15._4_4_;
        auVar16._8_4_ = auVar16._4_4_;
        auVar16._12_4_ = -(uint)(auVar16._4_4_ < 0);
        auVar15._8_4_ = auVar15._4_4_;
        auVar15._12_4_ = -(uint)(auVar15._4_4_ < 0);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        local_58.w = (qreal)((CONCAT44(-(uint)(iVar18 < 0),iVar18) -
                             CONCAT44(-(uint)(iVar17 < 0),iVar17)) + 1);
        local_58.h = (qreal)((auVar16._8_8_ - auVar15._8_8_) - auVar14._8_8_);
        QGraphicsItem::scroll((QGraphicsItem *)(this_01 + 0x10),(double)dx,(double)dy,&local_58);
        goto LAB_0030d5f0;
      }
      pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
    } while (pQVar8 != (QWidget *)0x0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetPrivate::scrollRect(this_00,r,dx,dy);
      return;
    }
  }
  else {
LAB_0030d5f0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::scroll(int dx, int dy, const QRect &r)
{

    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        if (!d->dirty.isEmpty()) {
            for (const QRect &rect : d->dirty.translated(dx, dy) & r)
                proxy->update(rect);
        }
        proxy->scroll(dx, dy, r.translated(proxy->subWidgetRect(this).topLeft().toPoint()));
        return;
    }
#endif
    d->scroll_sys(dx, dy, r);
}